

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCore_impl.hpp
# Opt level: O2

shared_ptr<helics::helicsCLI11App> __thiscall
helics::NetworkCore<helics::zeromq::ZmqComms,_(gmlc::networking::InterfaceTypes)0>::generateCLI
          (NetworkCore<helics::zeromq::ZmqComms,_(gmlc::networking::InterfaceTypes)0> *this)

{
  App *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  string_view localAddress;
  shared_ptr<helics::helicsCLI11App> sVar1;
  __shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  undefined1 local_48 [40];
  
  BrokerBase::generateCLI((BrokerBase *)this);
  localAddress._M_str = (char *)0x9;
  localAddress._M_len = in_RSI + 0xdc0;
  NetworkBrokerData::commandLineParser((NetworkBrokerData *)local_48,localAddress,true);
  local_48._16_8_ = local_48._0_8_;
  local_48._24_8_ = local_48._8_8_;
  local_48._0_8_ = (pointer)0x0;
  local_48._8_8_ = 0;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  this_00 = (App *)(this->super_CommsBroker<helics::zeromq::ZmqComms,_helics::CommonCore>).
                   super_CommonCore.super_Core._vptr_Core;
  CLI::std::__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_58,(__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x10));
  CLI::App::add_subcommand(this_00,(App_p *)&_Stack_58);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x18));
  sVar1.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar1.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> NetworkCore<COMMS, baseline>::generateCLI()
{
    auto app = CommonCore::generateCLI();
    CLI::App_p netApp =
        netInfo.commandLineParser(defLocalInterface[static_cast<int>(baseline)], false);
    app->add_subcommand(netApp);
    return app;
}